

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * iutest::StreamableToString<int>(string *__return_storage_ptr__,int *value)

{
  iuStreamMessage *this;
  iuStreamMessage local_1a0;
  int *local_18;
  int *value_local;
  
  local_18 = value;
  value_local = (int *)__return_storage_ptr__;
  detail::iuStreamMessage::iuStreamMessage(&local_1a0);
  this = detail::iuStreamMessage::operator<<(&local_1a0,local_18);
  detail::iuStreamMessage::GetString_abi_cxx11_(__return_storage_ptr__,this);
  detail::iuStreamMessage::~iuStreamMessage(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string StreamableToString(const T& value)
{
    return (Message() << value).GetString();
}